

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O2

int F(opt_state_t *opt_state,int code,int v0,int v1)

{
  int iVar1;
  valnode *pvVar2;
  vmapinfo *pvVar3;
  int iVar4;
  valnode **ppvVar5;
  valnode **ppvVar6;
  
  ppvVar6 = opt_state->hashtbl + (ulong)(uint)(v1 << 8 ^ v0 << 4 ^ code) % 0xd5;
  ppvVar5 = ppvVar6;
  while( true ) {
    pvVar2 = *ppvVar5;
    if (pvVar2 == (valnode *)0x0) {
      iVar1 = opt_state->curval;
      iVar4 = iVar1 + 1;
      opt_state->curval = iVar4;
      if ((code & 0xe6U) == 0) {
        pvVar3 = opt_state->vmap;
        pvVar3[(long)iVar1 + 1].const_val = v0;
        pvVar3[(long)iVar1 + 1].is_const = 1;
      }
      pvVar2 = opt_state->next_vnode;
      opt_state->next_vnode = pvVar2 + 1;
      pvVar2->val = iVar4;
      pvVar2->code = code;
      pvVar2->v0 = v0;
      pvVar2->v1 = v1;
      pvVar2->next = *ppvVar6;
      *ppvVar6 = pvVar2;
      return iVar4;
    }
    if (((pvVar2->code == code) && (pvVar2->v0 == v0)) && (pvVar2->v1 == v1)) break;
    ppvVar5 = &pvVar2->next;
  }
  return pvVar2->val;
}

Assistant:

static int
F(opt_state_t *opt_state, int code, int v0, int v1)
{
	u_int hash;
	int val;
	struct valnode *p;

	hash = (u_int)code ^ (v0 << 4) ^ (v1 << 8);
	hash %= MODULUS;

	for (p = opt_state->hashtbl[hash]; p; p = p->next)
		if (p->code == code && p->v0 == v0 && p->v1 == v1)
			return p->val;

	val = ++opt_state->curval;
	if (BPF_MODE(code) == BPF_IMM &&
	    (BPF_CLASS(code) == BPF_LD || BPF_CLASS(code) == BPF_LDX)) {
		opt_state->vmap[val].const_val = v0;
		opt_state->vmap[val].is_const = 1;
	}
	p = opt_state->next_vnode++;
	p->val = val;
	p->code = code;
	p->v0 = v0;
	p->v1 = v1;
	p->next = opt_state->hashtbl[hash];
	opt_state->hashtbl[hash] = p;

	return val;
}